

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  reference pcVar8;
  char *__first;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  anon_class_16_2_3f014a30 local_340;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_330;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_328;
  char *local_320;
  char *data;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  int local_304;
  char *pcStack_300;
  int i;
  char *p;
  int local_2ec;
  undefined1 local_2e8 [4];
  int digit_index;
  basic_string_view<char> s;
  type usize;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char local_a8 [8];
  char digits [40];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  const_iterator group;
  int local_60;
  int n;
  int size;
  int num_digits;
  char local_49 [8];
  char sep;
  void *local_38;
  undefined1 local_30 [8];
  string groups;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this_local;
  
  local_38 = (this->locale).locale_;
  groups.field_2._8_8_ = this;
  grouping<char>((string *)local_30,(locale_ref)local_38);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    local_49[0] = thousands_sep<char>((locale_ref)(this->locale).locale_);
    if (local_49[0] == '\0') {
      on_dec(this);
      local_49[1] = '\x01';
      local_49[2] = '\0';
      local_49[3] = '\0';
      local_49[4] = '\0';
    }
    else {
      iVar5 = count_digits(this->abs_value);
      group._M_current._4_4_ = iVar5;
      local_70._M_current = (char *)std::__cxx11::string::cbegin();
      local_60 = iVar5;
      while( true ) {
        local_78._M_current = (char *)std::__cxx11::string::cend();
        bVar2 = __gnu_cxx::operator!=(&local_70,&local_78);
        iVar6 = group._M_current._4_4_;
        bVar3 = false;
        if (bVar2) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_70);
          bVar3 = false;
          if (*pcVar8 < iVar6) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_70);
            bVar3 = false;
            if ('\0' < *pcVar8) {
              pcVar8 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_70);
              cVar1 = *pcVar8;
              cVar4 = max_value<char>();
              bVar3 = cVar1 != cVar4;
            }
          }
        }
        if (!bVar3) break;
        local_60 = local_60 + 1;
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_70);
        group._M_current._4_4_ = group._M_current._4_4_ - *pcVar8;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_70);
      }
      digits._32_8_ = std::__cxx11::string::cend();
      bVar3 = __gnu_cxx::operator==
                        (&local_70,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(digits + 0x20));
      if (bVar3) {
        iVar6 = group._M_current._4_4_ + -1;
        pcVar12 = (char *)std::__cxx11::string::back();
        local_60 = iVar6 / (int)*pcVar12 + local_60;
      }
      join_0x00000010_0x00000000_ =
           format_decimal<char,unsigned_long>(local_a8,this->abs_value,iVar5);
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&usize,
                 (allocator<char> *)((long)&s.size_ + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&s.size_ + 7));
      local_60 = local_60 + this->prefix_size;
      s.size_._0_4_ = to_unsigned<int>(local_60);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&usize,
                 (ulong)(type)s.size_);
      basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_2e8,local_49,1);
      local_2ec = 0;
      p = (char *)std::__cxx11::string::cbegin();
      local_70._M_current = p;
      pcStack_300 = buffer<char>::data((buffer<char> *)&usize);
      pcStack_300 = pcStack_300 + (long)local_60 + -1;
      local_304 = iVar5;
      while (local_304 = local_304 + -1, 0 < local_304) {
        *pcStack_300 = local_a8[local_304];
        pcStack_300 = pcStack_300 + -1;
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_70);
        if ('\0' < *pcVar8) {
          iVar5 = local_2ec + 1;
          local_2ec = iVar5;
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_70);
          if (iVar5 % (int)*pcVar8 == 0) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_70);
            cVar1 = *pcVar8;
            cVar4 = max_value<char>();
            if (cVar1 != cVar4) {
              local_310 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+(&local_70,1);
              data = (char *)std::__cxx11::string::cend();
              bVar3 = __gnu_cxx::operator!=
                                (&local_310,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&data);
              if (bVar3) {
                local_2ec = 0;
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_70);
              }
              __first = basic_string_view<char>::data((basic_string_view<char> *)local_2e8);
              pcVar9 = basic_string_view<char>::data((basic_string_view<char> *)local_2e8);
              sVar10 = basic_string_view<char>::size((basic_string_view<char> *)local_2e8);
              pcVar12 = pcStack_300;
              sVar11 = basic_string_view<char>::size((basic_string_view<char> *)local_2e8);
              pcVar12 = make_checked<char>(pcVar12,sVar11);
              std::uninitialized_copy<char_const*,char*>(__first,pcVar9 + sVar10,pcVar12);
              sVar10 = basic_string_view<char>::size((basic_string_view<char> *)local_2e8);
              pcStack_300 = pcStack_300 + -sVar10;
            }
          }
        }
      }
      *pcStack_300 = local_a8[0];
      if (this->prefix_size != 0) {
        pcStack_300[-1] = '-';
      }
      pcStack_300 = pcStack_300 + -1;
      local_340.data = buffer<char>::data((buffer<char> *)&usize);
      local_330.container =
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_340.size = local_60;
      local_320 = local_340.data;
      local_328.container =
           (buffer<char> *)
           write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                     (local_330.container,this->specs,(ulong)(type)s.size_,(ulong)(type)s.size_,
                      &local_340);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           local_328.container;
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&usize);
      local_49[1] = '\0';
      local_49[2] = '\0';
      local_49[3] = '\0';
      local_49[4] = '\0';
    }
  }
  else {
    on_dec(this);
    local_49[1] = '\x01';
    local_49[2] = '\0';
    local_49[3] = '\0';
    local_49[4] = '\0';
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }